

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O3

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::initiate_async_accept::operator()
          (initiate_async_accept *this,function<void_(const_std::error_code_&)> *handler,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,endpoint_type *peer_endpoint)

{
  undefined8 *puVar1;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)&local_40,handler);
  puVar1 = *(undefined8 **)this;
  detail::reactive_socket_service<asio::ip::tcp>::
  async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,std::function<void(std::error_code_const&)>,asio::any_io_executor>
            ((reactive_socket_service<asio::ip::tcp> *)*puVar1,(implementation_type *)(puVar1 + 1),
             peer,peer_endpoint,(function<void_(const_std::error_code_&)> *)&local_40,
             (any_io_executor *)(puVar1 + 4));
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void operator()(AcceptHandler&& handler,
        basic_socket<Protocol1, Executor1>* peer,
        endpoint_type* peer_endpoint) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a AcceptHandler.
      ASIO_ACCEPT_HANDLER_CHECK(AcceptHandler, handler) type_check;

      detail::non_const_lvalue<AcceptHandler> handler2(handler);
      self_->impl_.get_service().async_accept(
          self_->impl_.get_implementation(), *peer, peer_endpoint,
          handler2.value, self_->impl_.get_executor());
    }